

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O3

void __thiscall
jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
swap_l<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::json_const_reference_storage>
          (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *this,
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *other)

{
  json_reference_storage jVar1;
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> bVar2;
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> bVar3;
  half_storage hVar4;
  undefined8 uVar5;
  int64_t iVar6;
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> bVar7;
  common_storage cVar8;
  int64_t iVar9;
  void *__src;
  ulong uVar10;
  bool_storage temp;
  undefined1 auStack_ce [14];
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *pbStack_c0;
  undefined1 auStack_8e [22];
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *pbStack_78;
  undefined1 auStack_46 [22];
  
  jVar1 = (other->field_0).json_ref_;
  switch((byte)jVar1 & 0xf) {
  case 0:
  case 4:
    cVar8 = (other->field_0).common_;
    iVar9 = *(int64_t *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).int64_.val_ = iVar9;
    goto LAB_001e8baf;
  case 1:
    bVar7 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
            (other->field_0).boolean_.val_;
    cVar8 = (other->field_0).common_;
    iVar9 = *(int64_t *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).int64_.val_ = iVar9;
    this[2] = bVar7;
LAB_001e8baf:
    *(common_storage *)this = cVar8;
    return;
  default:
    uVar5 = *(undefined8 *)&other->field_0;
    iVar9 = (other->field_0).int64_.val_;
    iVar6 = *(int64_t *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).int64_.val_ = iVar6;
    *(undefined8 *)this = uVar5;
    *(int64_t *)(this + 8) = iVar9;
    return;
  case 6:
    hVar4 = (other->field_0).half_float_;
    iVar9 = *(int64_t *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).int64_.val_ = iVar9;
    *(half_storage *)this = hVar4;
    return;
  case 7:
    bVar7 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
            (other->field_0).common_.tag_;
    uVar10 = (ulong)((byte)jVar1 >> 4);
    memcpy(auStack_46,(void *)((long)&other->field_0 + 2),uVar10);
    auStack_46[uVar10] = 0;
    iVar9 = *(int64_t *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).int64_.val_ = iVar9;
    *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)jVar1;
    this[1] = bVar7;
    memcpy(this + 2,auStack_46,uVar10);
    this[uVar10 + 2] = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0x0;
    return;
  case 10:
  case 0xb:
    jVar1 = (other->field_0).json_ref_;
    pbStack_78 = this;
    switch((byte)jVar1 & 0xf) {
    case 0:
    case 4:
      cVar8 = (other->field_0).common_;
      iVar9 = *(int64_t *)(this + 8);
      *(undefined8 *)&other->field_0 = *(undefined8 *)this;
      (other->field_0).int64_.val_ = iVar9;
      goto LAB_001e8cef;
    case 1:
      bVar7 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
              (other->field_0).boolean_.val_;
      cVar8 = (other->field_0).common_;
      iVar9 = *(int64_t *)(this + 8);
      *(undefined8 *)&other->field_0 = *(undefined8 *)this;
      (other->field_0).int64_.val_ = iVar9;
      this[2] = bVar7;
LAB_001e8cef:
      *(common_storage *)this = cVar8;
      return;
    default:
      uVar5 = *(undefined8 *)&other->field_0;
      iVar9 = (other->field_0).int64_.val_;
      iVar6 = *(int64_t *)(this + 8);
      *(undefined8 *)&other->field_0 = *(undefined8 *)this;
      (other->field_0).int64_.val_ = iVar6;
      *(undefined8 *)this = uVar5;
      *(int64_t *)(this + 8) = iVar9;
      return;
    case 6:
      hVar4 = (other->field_0).half_float_;
      iVar9 = *(int64_t *)(this + 8);
      *(undefined8 *)&other->field_0 = *(undefined8 *)this;
      (other->field_0).int64_.val_ = iVar9;
      *(half_storage *)this = hVar4;
      return;
    case 7:
      bVar7 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
              (other->field_0).common_.tag_;
      uVar10 = (ulong)((byte)jVar1 >> 4);
      memcpy(auStack_8e,(void *)((long)&other->field_0 + 2),uVar10);
      auStack_8e[uVar10] = 0;
      iVar9 = *(int64_t *)(this + 8);
      *(undefined8 *)&other->field_0 = *(undefined8 *)this;
      (other->field_0).int64_.val_ = iVar9;
      *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)jVar1;
      this[1] = bVar7;
      memcpy(this + 2,auStack_8e,uVar10);
      this[uVar10 + 2] =
           (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0x0;
      return;
    case 10:
    case 0xb:
      jVar1 = (other->field_0).json_ref_;
      bVar7 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
              (other->field_0).common_.tag_;
      __src = (void *)((long)&other->field_0 + 2);
      uVar10 = (ulong)((byte)jVar1 >> 4);
      pbStack_c0 = this;
      memcpy(auStack_ce,__src,uVar10);
      auStack_ce[uVar10] = 0;
      bVar2 = *this;
      (other->field_0).json_ref_ = (json_reference_storage)((byte)jVar1 & 0xf0 | (byte)bVar2 & 0xf);
      bVar3 = *this;
      (other->field_0).json_ref_ = (json_reference_storage)((byte)bVar3 & 0xf0 | (byte)bVar2 & 0xf);
      (other->field_0).common_.tag_ = (semantic_tag)this[1];
      memcpy(__src,this + 2,(ulong)((byte)*this >> 4));
      *(undefined1 *)((long)&other->field_0 + (ulong)((byte)bVar3 >> 4) + 2) = 0;
      *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)jVar1;
      this[1] = bVar7;
      memcpy(this + 2,auStack_ce,uVar10);
      this[uVar10 + 2] =
           (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0x0;
      return;
    case 0xc:
      bVar7 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
              (other->field_0).common_.tag_;
      iVar9 = (other->field_0).int64_.val_;
      iVar6 = *(int64_t *)(this + 8);
      *(undefined8 *)&other->field_0 = *(undefined8 *)this;
      (other->field_0).int64_.val_ = iVar6;
      *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0xc;
      break;
    case 0xd:
      bVar7 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
              (other->field_0).common_.tag_;
      iVar9 = (other->field_0).int64_.val_;
      iVar6 = *(int64_t *)(this + 8);
      *(undefined8 *)&other->field_0 = *(undefined8 *)this;
      (other->field_0).int64_.val_ = iVar6;
      *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0xd;
      break;
    case 0xe:
      bVar7 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
              (other->field_0).common_.tag_;
      iVar9 = (other->field_0).int64_.val_;
      iVar6 = *(int64_t *)(this + 8);
      *(undefined8 *)&other->field_0 = *(undefined8 *)this;
      (other->field_0).int64_.val_ = iVar6;
      *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0xe;
      break;
    case 0xf:
      bVar7 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
              (other->field_0).common_.tag_;
      iVar9 = (other->field_0).int64_.val_;
      iVar6 = *(int64_t *)(this + 8);
      *(undefined8 *)&other->field_0 = *(undefined8 *)this;
      (other->field_0).int64_.val_ = iVar6;
      *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0xf;
    }
    this[1] = bVar7;
    *(int64_t *)(this + 8) = iVar9;
    return;
  case 0xc:
    bVar7 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
            (other->field_0).common_.tag_;
    iVar9 = (other->field_0).int64_.val_;
    iVar6 = *(int64_t *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).int64_.val_ = iVar6;
    *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0xc;
    break;
  case 0xd:
    bVar7 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
            (other->field_0).common_.tag_;
    iVar9 = (other->field_0).int64_.val_;
    iVar6 = *(int64_t *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).int64_.val_ = iVar6;
    *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0xd;
    break;
  case 0xe:
    bVar7 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
            (other->field_0).common_.tag_;
    iVar9 = (other->field_0).int64_.val_;
    iVar6 = *(int64_t *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).int64_.val_ = iVar6;
    *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0xe;
    break;
  case 0xf:
    bVar7 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)
            (other->field_0).common_.tag_;
    iVar9 = (other->field_0).int64_.val_;
    iVar6 = *(int64_t *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).int64_.val_ = iVar6;
    *this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>)0xf;
  }
  this[1] = bVar7;
  *(int64_t *)(this + 8) = iVar9;
  return;
}

Assistant:

void swap_l(basic_json& other) noexcept
        {
            switch (other.storage_kind())
            {
                case json_storage_kind::null         : swap_l_r<TypeL, null_storage>(other); break;
                case json_storage_kind::empty_object : swap_l_r<TypeL, empty_object_storage>(other); break;
                case json_storage_kind::boolean         : swap_l_r<TypeL, bool_storage>(other); break;
                case json_storage_kind::int64        : swap_l_r<TypeL, int64_storage>(other); break;
                case json_storage_kind::uint64       : swap_l_r<TypeL, uint64_storage>(other); break;
                case json_storage_kind::half_float         : swap_l_r<TypeL, half_storage>(other); break;
                case json_storage_kind::float64       : swap_l_r<TypeL, double_storage>(other); break;
                case json_storage_kind::short_str : swap_l_r<TypeL, short_string_storage>(other); break;
                case json_storage_kind::long_str  : swap_l_r<TypeL, long_string_storage>(other); break;
                case json_storage_kind::byte_str  : swap_l_r<TypeL, byte_string_storage>(other); break;
                case json_storage_kind::array        : swap_l_r<TypeL, array_storage>(other); break;
                case json_storage_kind::object       : swap_l_r<TypeL, object_storage>(other); break;
                case json_storage_kind::json_const_reference : swap_l_r<TypeL, json_const_reference_storage>(other); break;
                case json_storage_kind::json_reference : swap_l_r<TypeL, json_reference_storage>(other); break;
                default:
                    JSONCONS_UNREACHABLE();
                    break;
            }
        }